

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QDnsTlsAssociationRecord>::emplace<QDnsTlsAssociationRecord>
          (QMovableArrayOps<QDnsTlsAssociationRecord> *this,qsizetype i,
          QDnsTlsAssociationRecord *args)

{
  QDnsTlsAssociationRecord **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QDnsTlsAssociationRecord *pQVar4;
  QDnsTlsAssociationRecordPrivate *pQVar5;
  QDnsTlsAssociationRecord *pQVar6;
  QDnsTlsAssociationRecord *__dest;
  totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*> __old_val;
  long in_FS_OFFSET;
  bool bVar7;
  Inserter local_68;
  QDnsTlsAssociationRecord local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
           super_QArrayDataPointer<QDnsTlsAssociationRecord>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0023560e:
    pQVar5 = (args->d).d.ptr;
    (args->d).d.ptr = (QDnsTlsAssociationRecordPrivate *)0x0;
    bVar7 = (this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
            super_QArrayDataPointer<QDnsTlsAssociationRecord>.size != 0;
    QArrayDataPointer<QDnsTlsAssociationRecord>::detachAndGrow
              ((QArrayDataPointer<QDnsTlsAssociationRecord> *)this,(uint)(i == 0 && bVar7),1,
               (QDnsTlsAssociationRecord **)0x0,(QArrayDataPointer<QDnsTlsAssociationRecord> *)0x0);
    if (i == 0 && bVar7) {
      local_40.d.d.ptr =
           (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
           (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)0x0;
      (this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
      super_QArrayDataPointer<QDnsTlsAssociationRecord>.ptr[-1].d.d.ptr = pQVar5;
      ppQVar1 = &(this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
                 super_QArrayDataPointer<QDnsTlsAssociationRecord>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
                super_QArrayDataPointer<QDnsTlsAssociationRecord>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      pQVar6 = (this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
               super_QArrayDataPointer<QDnsTlsAssociationRecord>.ptr;
      pQVar4 = pQVar6 + i;
      __dest = pQVar4 + 1;
      local_68.nInserts = 1;
      local_68.bytes =
           ((this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
            super_QArrayDataPointer<QDnsTlsAssociationRecord>.size - i) * 8;
      local_68.data = (QArrayDataPointer<QDnsTlsAssociationRecord> *)this;
      local_68.displaceTo = __dest;
      memmove(__dest,pQVar6 + i,local_68.bytes);
      local_40.d.d.ptr =
           (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
           (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)0x0;
      (pQVar4->d).d.ptr = pQVar5;
      local_68.displaceFrom = __dest;
      Inserter::~Inserter(&local_68);
    }
    QDnsTlsAssociationRecord::~QDnsTlsAssociationRecord(&local_40);
  }
  else {
    if (((this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
         super_QArrayDataPointer<QDnsTlsAssociationRecord>.size == i) &&
       (pQVar4 = (this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
                 super_QArrayDataPointer<QDnsTlsAssociationRecord>.ptr,
       (pDVar3->super_QArrayData).alloc !=
       ((long)((long)pQVar4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
       i)) {
      pQVar5 = (args->d).d.ptr;
      (args->d).d.ptr = (QDnsTlsAssociationRecordPrivate *)0x0;
      pQVar4[i].d.d.ptr = pQVar5;
    }
    else {
      if ((i != 0) ||
         (pQVar4 = (this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
                   super_QArrayDataPointer<QDnsTlsAssociationRecord>.ptr,
         (QDnsTlsAssociationRecord *)
         ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar4))
      goto LAB_0023560e;
      pQVar5 = (args->d).d.ptr;
      (args->d).d.ptr = (QDnsTlsAssociationRecordPrivate *)0x0;
      pQVar4[-1].d.d.ptr = pQVar5;
      ppQVar1 = &(this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
                 super_QArrayDataPointer<QDnsTlsAssociationRecord>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
              super_QArrayDataPointer<QDnsTlsAssociationRecord>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }